

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

bool do_dump_ports(Port *p,char *name,void *v)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ostream *poVar6;
  ostream *poVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  MetaContainer meta_00;
  char *in_RSI;
  undefined8 *in_RDI;
  MetaIterator MVar8;
  char type;
  string doc;
  MetaIterator mdoc;
  MetaIterator mparameter;
  char *args;
  MetaContainer meta;
  ostream *o;
  Port *in_stack_fffffffffffff8d8;
  string *in_stack_fffffffffffff8e0;
  string *in_stack_fffffffffffff8e8;
  ostream *in_stack_fffffffffffff8f0;
  char *in_stack_fffffffffffff908;
  allocator<char> *in_stack_fffffffffffff910;
  char *in_stack_fffffffffffff918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff920;
  MetaContainer *in_stack_fffffffffffff928;
  bool local_6aa;
  bool local_6a9;
  MetaContainer in_stack_fffffffffffff970;
  string *in_stack_fffffffffffffa50;
  string *in_stack_fffffffffffffa58;
  string *in_stack_fffffffffffffa60;
  ostream *in_stack_fffffffffffffa68;
  ostream *in_stack_fffffffffffffa90;
  MetaContainer in_stack_fffffffffffffa98;
  allocator<char> local_311;
  string local_310 [32];
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [32];
  MetaIterator local_2a8;
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [37];
  byte local_24b;
  byte local_24a;
  allocator<char> local_249;
  string local_248 [32];
  MetaIterator local_228;
  char *local_218;
  char *local_210;
  char *local_208;
  MetaIterator local_200;
  MetaIterator local_1f0;
  MetaIterator local_1e0;
  MetaIterator local_1d0;
  ostream *local_1c0;
  char *local_1b8;
  MetaIterator local_1b0;
  char *local_1a0;
  char *local_198;
  char *local_190;
  MetaIterator local_188;
  MetaIterator local_178;
  MetaIterator local_168;
  MetaIterator local_158;
  MetaIterator local_148;
  MetaIterator local_138;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  undefined4 local_e0;
  char local_d9;
  char *local_d8;
  MetaIterator local_d0;
  MetaIterator local_c0;
  MetaIterator local_b0 [2];
  char *local_90;
  MetaIterator local_88;
  string local_78 [32];
  MetaIterator local_58;
  MetaIterator local_48;
  char *local_38;
  char *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  char *local_18;
  undefined8 *local_10;
  byte local_1;
  
  local_28 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = (char *)rtosc::Port::meta(in_stack_fffffffffffff8d8);
  local_38 = strchr((char *)*local_10,0x3a);
  local_48 = rtosc::Port::MetaContainer::find
                       ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_58 = rtosc::Port::MetaContainer::find
                       ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  std::__cxx11::string::string(local_78);
  local_90 = (char *)rtosc::Port::meta(in_stack_fffffffffffff8d8);
  local_88 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10a422);
  bVar2 = rtosc::Port::MetaIterator::operator!=(&local_58,local_88);
  if (bVar2) {
    std::__cxx11::string::operator=(local_78,local_58.value);
  }
  local_b0[0] = rtosc::Port::MetaContainer::find
                          ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
  local_c0 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10a4fc);
  bVar2 = rtosc::Port::MetaIterator::operator!=(local_b0,local_c0);
  if (bVar2) {
    std::__cxx11::string::operator+=(local_78,"[INTERNAL]");
  }
  local_d8 = (char *)rtosc::Port::meta(in_stack_fffffffffffff8d8);
  local_d0 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10a59d);
  bVar2 = rtosc::Port::MetaIterator::operator!=(&local_48,local_d0);
  if (bVar2) {
    local_d9 = '\0';
    if (local_38 != (char *)0x0) {
      pcVar5 = strchr(local_38,0x66);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = strchr(local_38,0x69);
        if (pcVar5 == (char *)0x0) {
          pcVar5 = strchr(local_38,99);
          if (pcVar5 == (char *)0x0) {
            pcVar5 = strchr(local_38,0x54);
            if (pcVar5 == (char *)0x0) {
              pcVar5 = strchr(local_38,0x73);
              if (pcVar5 != (char *)0x0) {
                local_d9 = 's';
              }
            }
            else {
              local_d9 = 't';
            }
          }
          else {
            local_d9 = 'c';
          }
        }
        else {
          local_d9 = 'i';
        }
      }
      else {
        local_d9 = 'f';
      }
    }
    if (local_d9 == '\0') {
      fprintf(_stderr,"rtosc port dumper: Cannot handle \'%s\'\n",local_18);
      fprintf(_stderr,"    args = <%s>\n",local_38);
      local_1 = 0;
      goto LAB_0010be7d;
    }
    if (local_d9 == 't') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
      std::__cxx11::string::string(local_128,local_78);
      dump_t_f_port(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
      std::__cxx11::string::~string(local_128);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator(&local_101);
      local_1 = 1;
      goto LAB_0010be7d;
    }
    poVar6 = std::operator<<((ostream *)local_28," <message_in pattern=\"");
    poVar6 = std::operator<<(poVar6,local_18);
    poVar6 = std::operator<<(poVar6,"\" typetag=\"");
    poVar6 = std::operator<<(poVar6,local_d9);
    std::operator<<(poVar6,"\">\n");
    poVar6 = std::operator<<((ostream *)local_28,"  <desc>Set Value of ");
    poVar6 = std::operator<<(poVar6,local_78);
    std::operator<<(poVar6,"</desc>\n");
    local_138 = rtosc::Port::MetaContainer::find
                          ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    local_148 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10a99f);
    bVar3 = rtosc::Port::MetaIterator::operator!=(&local_138,local_148);
    bVar2 = false;
    if (bVar3) {
      local_158 = rtosc::Port::MetaContainer::find
                            ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      local_168 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10aa56);
      bVar3 = rtosc::Port::MetaIterator::operator!=(&local_158,local_168);
      bVar2 = false;
      if (bVar3) {
        bVar2 = local_d9 != 'c';
      }
    }
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)local_28,"  <param_");
      poVar6 = std::operator<<(poVar6,local_d9);
      std::operator<<(poVar6," symbol=\"x\"");
      rtosc::Port::MetaContainer::operator[]
                (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920);
      units((ostream *)in_stack_fffffffffffff8e0,(char *)in_stack_fffffffffffff8d8);
      std::operator<<((ostream *)local_28,">\n");
      poVar6 = std::operator<<((ostream *)local_28,"   <range_min_max ");
      pcVar5 = "";
      if (local_d9 == 'f') {
        pcVar5 = "lmin=\"[\" lmax=\"]\"";
      }
      std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<((ostream *)local_28," min=\"");
      pcVar5 = rtosc::Port::MetaContainer::operator[]
                         (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920);
      poVar6 = std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<(poVar6,"\"  max=\"");
      pcVar5 = rtosc::Port::MetaContainer::operator[]
                         (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920);
      poVar6 = std::operator<<(poVar6,pcVar5);
      std::operator<<(poVar6,"\"/>\n");
      poVar6 = std::operator<<((ostream *)local_28,"  </param_");
      poVar6 = std::operator<<(poVar6,local_d9);
      std::operator<<(poVar6,">");
    }
    else {
      local_178 = rtosc::Port::MetaContainer::find
                            ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      local_188 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10ad49);
      bVar2 = rtosc::Port::MetaIterator::operator!=(&local_178,local_188);
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)local_28,"  <param_");
        poVar6 = std::operator<<(poVar6,local_d9);
        std::operator<<(poVar6," symbol=\"x\">\n");
        poVar6 = std::operator<<((ostream *)local_28,"    <range_min_max min=\"");
        local_190 = local_30;
        iVar4 = enum_min(in_stack_fffffffffffff970);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar4);
        std::operator<<(poVar6,"\" max=\"");
        pbVar1 = local_28;
        local_198 = local_30;
        iVar4 = enum_max(in_stack_fffffffffffff970);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)pbVar1,iVar4);
        std::operator<<(poVar6,"\">\n");
        local_1a0 = local_30;
        add_options(in_stack_fffffffffffffa90,in_stack_fffffffffffffa98);
        std::operator<<((ostream *)local_28,"    </range_min_max>\n");
        poVar6 = std::operator<<((ostream *)local_28,"  </param_");
        poVar6 = std::operator<<(poVar6,local_d9);
        std::operator<<(poVar6,">\n");
      }
      else {
        poVar6 = std::operator<<((ostream *)local_28,"  <param_");
        poVar6 = std::operator<<(poVar6,local_d9);
        std::operator<<(poVar6," symbol=\"x\"");
        rtosc::Port::MetaContainer::operator[]
                  (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920);
        units((ostream *)in_stack_fffffffffffff8e0,(char *)in_stack_fffffffffffff8d8);
        std::operator<<((ostream *)local_28,"/>\n");
      }
    }
    std::operator<<((ostream *)local_28," </message_in>\n");
    poVar6 = std::operator<<((ostream *)local_28," <message_in pattern=\"");
    poVar6 = std::operator<<(poVar6,local_18);
    std::operator<<(poVar6,"\" typetag=\"\">\n");
    poVar6 = std::operator<<((ostream *)local_28,"  <desc>Get Value of ");
    poVar6 = std::operator<<(poVar6,local_78);
    std::operator<<(poVar6,"</desc>\n");
    std::operator<<((ostream *)local_28," </message_in>\n");
    poVar6 = std::operator<<((ostream *)local_28," <message_out pattern=\"");
    poVar6 = std::operator<<(poVar6,local_18);
    poVar6 = std::operator<<(poVar6,"\" typetag=\"");
    poVar6 = std::operator<<(poVar6,local_d9);
    std::operator<<(poVar6,"\">\n");
    poVar6 = std::operator<<((ostream *)local_28,"  <desc>Value of ");
    poVar6 = std::operator<<(poVar6,local_78);
    std::operator<<(poVar6,"</desc>\n");
    local_1b0 = rtosc::Port::MetaContainer::find
                          ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    meta_00.str_ptr = local_1b0.value;
    MVar8 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10b225);
    local_1b8 = MVar8.value;
    poVar6 = (ostream *)MVar8.title;
    local_1c0 = poVar6;
    bVar3 = rtosc::Port::MetaIterator::operator!=(&local_1b0,MVar8);
    bVar2 = false;
    if (bVar3) {
      local_1d0 = rtosc::Port::MetaContainer::find
                            ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      local_1e0 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10b2dc);
      bVar3 = rtosc::Port::MetaIterator::operator!=(&local_1d0,local_1e0);
      bVar2 = false;
      if (bVar3) {
        bVar2 = local_d9 != 'c';
      }
    }
    if (bVar2) {
      poVar6 = std::operator<<((ostream *)local_28,"  <param_");
      poVar6 = std::operator<<(poVar6,local_d9);
      std::operator<<(poVar6," symbol=\"x\"");
      rtosc::Port::MetaContainer::operator[]
                (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920);
      units((ostream *)in_stack_fffffffffffff8e0,(char *)in_stack_fffffffffffff8d8);
      std::operator<<((ostream *)local_28,">\n");
      poVar6 = std::operator<<((ostream *)local_28,"   <range_min_max ");
      pcVar5 = "";
      if (local_d9 == 'f') {
        pcVar5 = "lmin=\"[\" lmax=\"]\"";
      }
      std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<((ostream *)local_28," min=\"");
      pcVar5 = rtosc::Port::MetaContainer::operator[]
                         (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920);
      poVar6 = std::operator<<(poVar6,pcVar5);
      poVar6 = std::operator<<(poVar6,"\"  max=\"");
      pcVar5 = rtosc::Port::MetaContainer::operator[]
                         (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920);
      poVar6 = std::operator<<(poVar6,pcVar5);
      std::operator<<(poVar6,"\"/>\n");
      poVar6 = std::operator<<((ostream *)local_28,"  </param_");
      poVar6 = std::operator<<(poVar6,local_d9);
      std::operator<<(poVar6,">\n");
    }
    else {
      local_1f0 = rtosc::Port::MetaContainer::find
                            ((MetaContainer *)in_stack_fffffffffffff910,in_stack_fffffffffffff908);
      local_200 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10b5cf);
      bVar2 = rtosc::Port::MetaIterator::operator!=(&local_1f0,local_200);
      if (bVar2) {
        poVar7 = std::operator<<((ostream *)local_28,"  <param_");
        poVar7 = std::operator<<(poVar7,local_d9);
        std::operator<<(poVar7," symbol=\"x\">\n");
        poVar7 = std::operator<<((ostream *)local_28,"    <range_min_max min=\"");
        local_208 = local_30;
        iVar4 = enum_min(in_stack_fffffffffffff970);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar4);
        std::operator<<(poVar7,"\" max=\"");
        pbVar1 = local_28;
        local_210 = local_30;
        iVar4 = enum_max(in_stack_fffffffffffff970);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)pbVar1,iVar4);
        std::operator<<(poVar7,"\">\n");
        local_218 = local_30;
        add_options(poVar6,meta_00);
        std::operator<<((ostream *)local_28,"    </range_min_max>\n");
        poVar6 = std::operator<<((ostream *)local_28,"  </param_");
        poVar6 = std::operator<<(poVar6,local_d9);
        std::operator<<(poVar6,">\n");
      }
      else {
        poVar6 = std::operator<<((ostream *)local_28,"  <param_");
        poVar6 = std::operator<<(poVar6,local_d9);
        std::operator<<(poVar6," symbol=\"x\"");
        rtosc::Port::MetaContainer::operator[]
                  (in_stack_fffffffffffff928,(char *)in_stack_fffffffffffff920);
        units((ostream *)in_stack_fffffffffffff8e0,(char *)in_stack_fffffffffffff8d8);
        std::operator<<((ostream *)local_28,"/>\n");
      }
    }
    std::operator<<((ostream *)local_28," </message_out>\n");
  }
  else {
    local_24a = 0;
    local_24b = 0;
    local_228 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10b8db);
    bVar2 = rtosc::Port::MetaIterator::operator!=(&local_58,local_228);
    local_6a9 = false;
    if (bVar2) {
      local_6aa = true;
      if (local_38 != (char *)0x0) {
        std::allocator<char>::allocator();
        local_24a = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
        local_24b = 1;
        local_6aa = std::operator==((char *)in_stack_fffffffffffff8e0,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff8d8);
      }
      local_6a9 = local_6aa;
    }
    if ((local_24b & 1) != 0) {
      std::__cxx11::string::~string(local_248);
    }
    if ((local_24a & 1) != 0) {
      std::allocator<char>::~allocator(&local_249);
    }
    if (local_6a9 == false) {
      MVar8 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10bb88);
      local_2a8 = MVar8;
      bVar2 = rtosc::Port::MetaIterator::operator!=(&local_58,MVar8);
      if ((!bVar2) || (local_38 == (char *)0x0)) {
        MVar8 = rtosc::Port::MetaContainer::end((MetaContainer *)0x10bd8a);
        bVar2 = rtosc::Port::MetaIterator::operator!=(&local_58,MVar8);
        if (bVar2) {
          fprintf(_stderr,"Skipping \"%s\"\n",local_18);
          if (local_38 != (char *)0x0) {
            fprintf(_stderr,"    type = %s\n",local_38);
          }
          local_1 = 0;
        }
        else {
          fprintf(_stderr,"Skipping [UNDOCUMENTED] \"%s\"\n",local_18);
          local_1 = 0;
        }
        goto LAB_0010be7d;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff920,MVar8.title,(allocator<char> *)MVar8.value);
      std::__cxx11::string::string(local_2f0,local_78);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff920,MVar8.title,(allocator<char> *)MVar8.value);
      dump_generic_port(in_stack_fffffffffffffa68,in_stack_fffffffffffffa60,
                        in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator(&local_311);
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_28,in_stack_fffffffffffff918,in_stack_fffffffffffff910);
      std::__cxx11::string::string(local_298,local_78);
      dump_any_port(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator(&local_271);
    }
  }
  local_1 = 1;
LAB_0010be7d:
  local_e0 = 1;
  std::__cxx11::string::~string(local_78);
  return (bool)(local_1 & 1);
}

Assistant:

static bool do_dump_ports(const rtosc::Port *p, const char *name, void *v)
{
    std::ostream &o  = *(std::ostream*)v;
    auto meta        = p->meta();
    const char *args = strchr(p->name, ':');
    auto mparameter  = meta.find("parameter");
    auto mdoc        = meta.find("documentation");
    string doc;

    if(mdoc != p->meta().end())
        doc = mdoc.value;
    if(meta.find("internal") != meta.end()) {
        doc += "[INTERNAL]";
    }

    if(mparameter != p->meta().end()) {
        char type = 0;
        if(args) {
            if(strchr(args, 'f'))
                type = 'f';
            else if(strchr(args, 'i'))
                type = 'i';
            else if(strchr(args, 'c'))
                type = 'c';
            else if(strchr(args, 'T'))
                type = 't';
            else if(strchr(args, 's'))
                type = 's';
        }

        if(!type) {
            fprintf(stderr, "rtosc port dumper: Cannot handle '%s'\n", name);
            fprintf(stderr, "    args = <%s>\n", args);
            return false;
        }

        if(type == 't') {
            dump_t_f_port(o, name, doc);
            return true;
        }

        o << " <message_in pattern=\"" << name << "\" typetag=\"" << type << "\">\n";
        o << "  <desc>Set Value of " << doc << "</desc>\n";
        if(meta.find("min") != meta.end() && meta.find("max") != meta.end() && type != 'c') {
            o << "  <param_" << type << " symbol=\"x\"";
            units(o, meta["unit"]);
            o << ">\n";
            o << "   <range_min_max " << (type == 'f' ? "lmin=\"[\" lmax=\"]\"" : "");
            o << " min=\"" << meta["min"] << "\"  max=\"" << meta["max"] << "\"/>\n";
            o << "  </param_" << type << ">";
        } else if(meta.find("enumerated") != meta.end()) {
            o << "  <param_" << type << " symbol=\"x\">\n";
            o << "    <range_min_max min=\"" << enum_min(meta) << "\" max=\"";
            o << enum_max(meta) << "\">\n";
            add_options(o, meta);
            o << "    </range_min_max>\n";
            o << "  </param_" << type << ">\n";
        } else {
            o << "  <param_" << type << " symbol=\"x\"";
            units(o, meta["unit"]);
            o << "/>\n";
        }
        o << " </message_in>\n";
        o << " <message_in pattern=\"" << name << "\" typetag=\"\">\n";
        o << "  <desc>Get Value of " << doc << "</desc>\n";
        o << " </message_in>\n";
        o << " <message_out pattern=\"" << name << "\" typetag=\"" << type << "\">\n";
        o << "  <desc>Value of " << doc << "</desc>\n";
        if(meta.find("min") != meta.end() && meta.find("max") != meta.end() && type != 'c') {
            o << "  <param_" << type << " symbol=\"x\"";
            units(o, meta["unit"]);
            o << ">\n";
            o << "   <range_min_max " << (type == 'f' ? "lmin=\"[\" lmax=\"]\"" : "");
            o << " min=\"" << meta["min"] << "\"  max=\"" << meta["max"] << "\"/>\n";
            o << "  </param_" << type << ">\n";
        } else if(meta.find("enumerated") != meta.end()) {
            o << "  <param_" << type << " symbol=\"x\">\n";
            o << "    <range_min_max min=\"" << enum_min(meta) << "\" max=\"";
            o << enum_max(meta) << "\">\n";
            add_options(o, meta);
            o << "    </range_min_max>\n";
            o << "  </param_" << type << ">\n";
        } else {
            o << "  <param_" << type << " symbol=\"x\"";
            units(o, meta["unit"]);
            o << "/>\n";
        }
        o << " </message_out>\n";
    } else if(mdoc != meta.end() && (!args || args == std::string(""))) {
        dump_any_port(o, name, doc);
    } else if(mdoc != meta.end() && args) {
        dump_generic_port(o, name, doc, args);
    } else if(mdoc != meta.end()) {
        fprintf(stderr, "Skipping \"%s\"\n", name);
        if(args) {
            fprintf(stderr, "    type = %s\n", args);
        }
        return false;
    } else {
        fprintf(stderr, "Skipping [UNDOCUMENTED] \"%s\"\n", name);
        return false;
    }
    return true;
}